

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_list(_garray *x,t_symbol *s,int argc,t_atom *argv)

{
  _array *p_Var1;
  t_float tVar2;
  int local_44;
  int firstindex;
  _array *array;
  int local_30;
  int elemsize;
  int yonset;
  int i;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  _garray *x_local;
  
  _yonset = argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  p_Var1 = garray_getarray_floatonly(x,&local_30,(int *)((long)&array + 4));
  if (p_Var1 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",(s_local[1].s_next)->s_name);
  }
  else if (1 < argv_local._4_4_) {
    tVar2 = atom_getfloat(_yonset);
    local_44 = (int)tVar2;
    argv_local._4_4_ = argv_local._4_4_ + -1;
    _yonset = _yonset + 1;
    if (local_44 < 0) {
      argv_local._4_4_ = local_44 + argv_local._4_4_;
      _yonset = _yonset + -(long)local_44;
      local_44 = 0;
      if (argv_local._4_4_ < 1) {
        return;
      }
    }
    if ((argv_local._4_4_ + local_44 <= p_Var1->a_n) ||
       (argv_local._4_4_ = p_Var1->a_n - local_44, 0 < argv_local._4_4_)) {
      for (elemsize = 0; elemsize < argv_local._4_4_; elemsize = elemsize + 1) {
        tVar2 = atom_getfloat(_yonset + elemsize);
        *(t_float *)
         (p_Var1->a_vec + (long)local_30 * 4 + (long)(array._4_4_ * (elemsize + local_44))) = tVar2;
      }
      garray_redraw((_garray *)s_local);
    }
  }
  return;
}

Assistant:

static void garray_list(t_garray *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    int yonset, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    if (argc < 2) return;
    else
    {
        int firstindex = atom_getfloat(argv);
        argc--;
        argv++;
            /* drop negative x values */
        if (firstindex < 0)
        {
            argc += firstindex;
            argv -= firstindex;
            firstindex = 0;
            if (argc <= 0) return;
        }
        if (argc + firstindex > array->a_n)
        {
            argc = array->a_n - firstindex;
            if (argc <= 0) return;
        }
        for (i = 0; i < argc; i++)
            *((t_float *)(array->a_vec + elemsize * (i + firstindex)) + yonset)
                = atom_getfloat(argv + i);
    }
    garray_redraw(x);
}